

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O3

void __thiscall Movegen::generate<(Movetype)10,(Piece)6>(Movegen *this)

{
  Square *pSVar1;
  Color CVar2;
  long lVar3;
  bool bVar4;
  U8 UVar5;
  Square *pSVar6;
  U64 UVar7;
  ulong uVar8;
  U64 UVar9;
  int iVar10;
  uint uVar11;
  code *pcVar12;
  Square SVar13;
  U8 UVar14;
  ulong uVar15;
  U8 *pUVar16;
  bool bVar17;
  ulong local_40;
  ulong local_38;
  
  uVar8 = this->check_target;
  if (uVar8 == 0) {
    if (this->pawns7 != 0) {
      pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)1>;
      if (this->us == white) {
        pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)0>;
      }
      local_38 = this->pawns7;
      (*pcVar12)(&local_38);
      uVar8 = local_38 & this->qtarget;
      if (uVar8 != 0) {
        CVar2 = this->us;
        uVar15 = (ulong)this->last;
        pUVar16 = &this->list[uVar15 + 3].type;
        do {
          lVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          UVar5 = (U8)lVar3;
          UVar14 = (CVar2 != white) * '\x10' + -8 + UVar5;
          uVar11 = (int)uVar15 + 4;
          uVar15 = (ulong)uVar11;
          pUVar16[-0xb] = UVar14;
          pUVar16[-10] = UVar5;
          pUVar16[-9] = 0;
          pUVar16[-8] = UVar14;
          pUVar16[-7] = UVar5;
          pUVar16[-6] = 1;
          pUVar16[-5] = UVar14;
          pUVar16[-4] = UVar5;
          pUVar16[-3] = 2;
          ((Move *)(pUVar16 + -2))->f = UVar14;
          pUVar16[-1] = UVar5;
          *pUVar16 = '\x03';
          pUVar16 = pUVar16 + 0xc;
          uVar8 = uVar8 & uVar8 - 1;
        } while (uVar8 != 0);
        this->last = uVar11;
      }
    }
    pSVar6 = this->knights;
    SVar13 = *pSVar6;
    if (SVar13 != no_square) {
      iVar10 = this->last;
      uVar8 = this->qtarget;
      do {
        uVar15 = (&bitboards::nmask)[SVar13] & uVar8;
        if (uVar15 != 0) {
          pUVar16 = &this->list[iVar10].type;
          do {
            lVar3 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)SVar13;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            iVar10 = iVar10 + 1;
            uVar15 = uVar15 & uVar15 - 1;
          } while (uVar15 != 0);
          this->last = iVar10;
        }
        SVar13 = pSVar6[1];
        pSVar6 = pSVar6 + 1;
      } while (SVar13 != no_square);
    }
    pSVar6 = this->bishops;
    if (*pSVar6 != no_square) {
      do {
        UVar7 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar6);
        uVar8 = UVar7 & this->qtarget;
        if (uVar8 != 0) {
          SVar13 = *pSVar6;
          uVar15 = (ulong)this->last;
          pUVar16 = &this->list[uVar15].type;
          do {
            lVar3 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar13;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar11 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar11;
            uVar8 = uVar8 & uVar8 - 1;
          } while (uVar8 != 0);
          this->last = uVar11;
        }
        pSVar1 = pSVar6 + 1;
        pSVar6 = pSVar6 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar6 = this->rooks;
    if (*pSVar6 != no_square) {
      do {
        UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar6);
        uVar8 = UVar7 & this->qtarget;
        if (uVar8 != 0) {
          SVar13 = *pSVar6;
          uVar15 = (ulong)this->last;
          pUVar16 = &this->list[uVar15].type;
          do {
            lVar3 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar13;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar11 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar11;
            uVar8 = uVar8 & uVar8 - 1;
          } while (uVar8 != 0);
          this->last = uVar11;
        }
        pSVar1 = pSVar6 + 1;
        pSVar6 = pSVar6 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar6 = this->queens;
    if (*pSVar6 != no_square) {
      do {
        UVar7 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar6);
        UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar6);
        uVar8 = (UVar9 | UVar7) & this->qtarget;
        if (uVar8 != 0) {
          SVar13 = *pSVar6;
          uVar15 = (ulong)this->last;
          pUVar16 = &this->list[uVar15].type;
          do {
            lVar3 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar13;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar11 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar11;
            uVar8 = uVar8 & uVar8 - 1;
          } while (uVar8 != 0);
          this->last = uVar11;
        }
        pSVar1 = pSVar6 + 1;
        pSVar6 = pSVar6 + 1;
      } while (*pSVar1 != no_square);
    }
    uVar8 = (ulong)this->us;
    local_40 = this->pawns;
    if (local_40 != 0) {
      local_38 = *(ulong *)(bitboards::pawnmask + uVar8 * 8) & local_40;
      local_40 = local_40 & this->rank2;
      pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)1>;
      if (uVar8 == 0) {
        pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)0>;
      }
      (*pcVar12)(&local_38);
      local_38 = local_38 & this->qtarget;
      bVar4 = true;
      do {
        bVar17 = bVar4;
        (*pcVar12)(&local_40);
        local_40 = local_40 & this->empty;
        bVar4 = false;
      } while (bVar17);
      local_40 = (-(ulong)(this->evasion_target == 0) | this->evasion_target) & local_40;
      if (local_38 != 0) {
        uVar15 = (ulong)this->last;
        pUVar16 = &this->list[uVar15].type;
        do {
          lVar3 = 0;
          if (local_38 != 0) {
            for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = (U8)lVar3 + (uVar8 != 0) * '\x10' + -8;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar11 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar11;
          local_38 = local_38 & local_38 - 1;
        } while (local_38 != 0);
        this->last = uVar11;
      }
      if (local_40 != 0) {
        uVar15 = (ulong)this->last;
        pUVar16 = &this->list[uVar15].type;
        do {
          lVar3 = 0;
          if (local_40 != 0) {
            for (; (local_40 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = (uVar8 != 0) * ' ' + -0x10 + (U8)lVar3;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar11 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar11;
          local_40 = local_40 & local_40 - 1;
        } while (local_40 != 0);
        this->last = uVar11;
      }
    }
    uVar8 = this->empty & (&bitboards::kmask)[*this->kings];
    UVar5 = (U8)*this->kings;
    if (uVar8 != 0) {
      uVar15 = (ulong)this->last;
      pUVar16 = &this->list[uVar15].type;
      do {
        lVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar16 + -2))->f = UVar5;
        pUVar16[-1] = (U8)lVar3;
        *pUVar16 = '\n';
        pUVar16 = pUVar16 + 3;
        uVar11 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar11;
        uVar8 = uVar8 & uVar8 - 1;
      } while (uVar8 != 0);
      this->last = uVar11;
    }
    if (this->can_castle_ks == true) {
      iVar10 = this->last;
      this->last = iVar10 + 1;
      UVar14 = '>';
      if (this->us == white) {
        UVar14 = '\x06';
      }
      this->list[iVar10].f = UVar5;
      this->list[iVar10].t = UVar14;
      this->list[iVar10].type = '\b';
    }
    if (this->can_castle_qs == true) {
      iVar10 = this->last;
      this->last = iVar10 + 1;
      UVar14 = ':';
      if (this->us == white) {
        UVar14 = '\x02';
      }
      this->list[iVar10].f = UVar5;
      this->list[iVar10].t = UVar14;
      this->list[iVar10].type = '\t';
    }
  }
  else {
    if (this->evasion_target == 0) {
      SVar13 = *this->kings;
      uVar8 = this->empty & (&bitboards::kmask)[SVar13];
      if (uVar8 == 0) {
        return;
      }
      uVar15 = (ulong)this->last;
      pUVar16 = &this->list[uVar15].type;
      do {
        lVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar16 + -2))->f = (U8)SVar13;
        pUVar16[-1] = (U8)lVar3;
        *pUVar16 = '\n';
        pUVar16 = pUVar16 + 3;
        uVar11 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar11;
        uVar8 = uVar8 & uVar8 - 1;
      } while (uVar8 != 0);
    }
    else {
      if ((uVar8 & uVar8 - 1) == 0) {
        pSVar6 = this->knights;
        SVar13 = *pSVar6;
        if (SVar13 != no_square) {
          iVar10 = this->last;
          uVar8 = this->qtarget;
          do {
            uVar15 = (&bitboards::nmask)[SVar13] & uVar8;
            if (uVar15 != 0) {
              pUVar16 = &this->list[iVar10].type;
              do {
                lVar3 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (U8)SVar13;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                iVar10 = iVar10 + 1;
                uVar15 = uVar15 & uVar15 - 1;
              } while (uVar15 != 0);
              this->last = iVar10;
            }
            SVar13 = pSVar6[1];
            pSVar6 = pSVar6 + 1;
          } while (SVar13 != no_square);
        }
        pSVar6 = this->bishops;
        if (*pSVar6 != no_square) {
          do {
            UVar7 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar6);
            uVar8 = UVar7 & this->qtarget;
            if (uVar8 != 0) {
              SVar13 = *pSVar6;
              uVar15 = (ulong)this->last;
              pUVar16 = &this->list[uVar15].type;
              do {
                lVar3 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar13;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                uVar11 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar11;
                uVar8 = uVar8 & uVar8 - 1;
              } while (uVar8 != 0);
              this->last = uVar11;
            }
            pSVar1 = pSVar6 + 1;
            pSVar6 = pSVar6 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar6 = this->rooks;
        if (*pSVar6 != no_square) {
          do {
            UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar6);
            uVar8 = UVar7 & this->qtarget;
            if (uVar8 != 0) {
              SVar13 = *pSVar6;
              uVar15 = (ulong)this->last;
              pUVar16 = &this->list[uVar15].type;
              do {
                lVar3 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar13;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                uVar11 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar11;
                uVar8 = uVar8 & uVar8 - 1;
              } while (uVar8 != 0);
              this->last = uVar11;
            }
            pSVar1 = pSVar6 + 1;
            pSVar6 = pSVar6 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar6 = this->queens;
        if (*pSVar6 != no_square) {
          do {
            UVar7 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar6);
            UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar6);
            uVar8 = (UVar9 | UVar7) & this->qtarget;
            if (uVar8 != 0) {
              SVar13 = *pSVar6;
              uVar15 = (ulong)this->last;
              pUVar16 = &this->list[uVar15].type;
              do {
                lVar3 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar13;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                uVar11 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar11;
                uVar8 = uVar8 & uVar8 - 1;
              } while (uVar8 != 0);
              this->last = uVar11;
            }
            pSVar1 = pSVar6 + 1;
            pSVar6 = pSVar6 + 1;
          } while (*pSVar1 != no_square);
        }
        local_38 = this->pawns7;
        if (local_38 != 0) {
          pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)1>;
          if (this->us == white) {
            pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)0>;
          }
          (*pcVar12)(&local_38);
          local_38 = local_38 & this->qtarget;
          if (local_38 != 0) {
            CVar2 = this->us;
            uVar8 = (ulong)this->last;
            pUVar16 = &this->list[uVar8 + 3].type;
            do {
              lVar3 = 0;
              if (local_38 != 0) {
                for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              UVar5 = (U8)lVar3;
              UVar14 = (CVar2 != white) * '\x10' + -8 + UVar5;
              uVar11 = (int)uVar8 + 4;
              uVar8 = (ulong)uVar11;
              pUVar16[-0xb] = UVar14;
              pUVar16[-10] = UVar5;
              pUVar16[-9] = 0;
              pUVar16[-8] = UVar14;
              pUVar16[-7] = UVar5;
              pUVar16[-6] = 1;
              pUVar16[-5] = UVar14;
              pUVar16[-4] = UVar5;
              pUVar16[-3] = 2;
              ((Move *)(pUVar16 + -2))->f = UVar14;
              pUVar16[-1] = UVar5;
              *pUVar16 = '\x03';
              pUVar16 = pUVar16 + 0xc;
              local_38 = local_38 & local_38 - 1;
            } while (local_38 != 0);
            this->last = uVar11;
          }
        }
        uVar8 = (ulong)this->us;
        local_40 = this->pawns;
        if (local_40 != 0) {
          local_38 = *(ulong *)(bitboards::pawnmask + uVar8 * 8) & local_40;
          local_40 = local_40 & this->rank2;
          pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)1>;
          if (uVar8 == 0) {
            pcVar12 = anon_unknown.dwarf_96215::shift<(Dir)0>;
          }
          (*pcVar12)(&local_38);
          local_38 = local_38 & this->qtarget;
          bVar4 = true;
          do {
            bVar17 = bVar4;
            (*pcVar12)(&local_40);
            local_40 = local_40 & this->empty;
            bVar4 = false;
          } while (bVar17);
          local_40 = (-(ulong)(this->evasion_target == 0) | this->evasion_target) & local_40;
          if (local_38 != 0) {
            uVar15 = (ulong)this->last;
            pUVar16 = &this->list[uVar15].type;
            do {
              lVar3 = 0;
              if (local_38 != 0) {
                for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              ((Move *)(pUVar16 + -2))->f = (U8)lVar3 + (uVar8 != 0) * '\x10' + -8;
              pUVar16[-1] = (U8)lVar3;
              *pUVar16 = '\n';
              pUVar16 = pUVar16 + 3;
              uVar11 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar11;
              local_38 = local_38 & local_38 - 1;
            } while (local_38 != 0);
            this->last = uVar11;
          }
          if (local_40 != 0) {
            uVar15 = (ulong)this->last;
            pUVar16 = &this->list[uVar15].type;
            do {
              lVar3 = 0;
              if (local_40 != 0) {
                for (; (local_40 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              ((Move *)(pUVar16 + -2))->f = (uVar8 != 0) * ' ' + -0x10 + (U8)lVar3;
              pUVar16[-1] = (U8)lVar3;
              *pUVar16 = '\n';
              pUVar16 = pUVar16 + 3;
              uVar11 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar11;
              local_40 = local_40 & local_40 - 1;
            } while (local_40 != 0);
            this->last = uVar11;
          }
        }
      }
      SVar13 = *this->kings;
      uVar8 = this->empty & (&bitboards::kmask)[SVar13];
      if (uVar8 == 0) {
        return;
      }
      uVar15 = (ulong)this->last;
      pUVar16 = &this->list[uVar15].type;
      do {
        lVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar16 + -2))->f = (U8)SVar13;
        pUVar16[-1] = (U8)lVar3;
        *pUVar16 = '\n';
        pUVar16 = pUVar16 + 3;
        uVar11 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar11;
        uVar8 = uVar8 & uVar8 - 1;
      } while (uVar8 != 0);
    }
    this->last = uVar11;
  }
  return;
}

Assistant:

inline void Movegen::generate<quiet, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) {
		generate<promotion, pawn>();
		generate<quiet, knight>();
		generate<quiet, bishop>();
		generate<quiet, rook>();
		generate<quiet, queen>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		generate<quiet, king>();
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<quiet, knight>();
			generate<quiet, bishop>();
			generate<quiet, rook>();
			generate<quiet, queen>();
			generate<promotion, pawn>();
			generate<quiet, pawn>();
		}
		generate<quiet, king>();
	}

}